

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddZddIsop.c
# Opt level: O3

DdNode * Cudd_MakeBddFromZddCover(DdManager *dd,DdNode *node)

{
  DdNode *pDVar1;
  
  do {
    dd->reordered = 0;
    pDVar1 = cuddMakeBddFromZddCover(dd,node);
  } while (dd->reordered == 1);
  return pDVar1;
}

Assistant:

DdNode  *
Cudd_MakeBddFromZddCover(
  DdManager * dd,
  DdNode * node)
{
    DdNode      *res;

    do {
        dd->reordered = 0;
        res = cuddMakeBddFromZddCover(dd, node);
    } while (dd->reordered == 1);
    return(res);
}